

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorOperations.hpp
# Opt level: O3

void __thiscall
helics::CustomTranslatorOperator::~CustomTranslatorOperator(CustomTranslatorOperator *this)

{
  (this->super_TranslatorOperator)._vptr_TranslatorOperator =
       (_func_int **)&PTR__CustomTranslatorOperator_00542d20;
  if (*(code **)&this->field_0x40 != (code *)0x0) {
    (**(code **)&this->field_0x40)(&this->toMessageFunction,&this->toMessageFunction,3);
  }
  if (*(code **)&this->field_0x20 != (code *)0x0) {
    (**(code **)&this->field_0x20)(&this->toValueFunction,&this->toValueFunction,3);
  }
  operator_delete(this,0x50);
  return;
}

Assistant:

CustomTranslatorOperator() = default;